

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O1

bool __thiscall
QParallelAnimationGroupPrivate::shouldAnimationStart
          (QParallelAnimationGroupPrivate *this,QAbstractAnimation *animation,bool startIfAtEnd)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  parameter_type pVar4;
  
  iVar3 = QAbstractAnimation::totalDuration((QAbstractAnimation *)animation);
  if (iVar3 == -1) {
    bVar2 = isUncontrolledAnimationFinished(this,animation);
    bVar2 = !bVar2;
  }
  else if (startIfAtEnd) {
    bVar2 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime <=
            iVar3;
  }
  else {
    pVar4 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
            ::value(&(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.direction)
    ;
    iVar1 = (this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime;
    if (pVar4 == Forward) {
      bVar2 = iVar1 < iVar3;
    }
    else {
      bVar2 = iVar1 <= iVar3 && iVar1 != 0;
    }
  }
  return bVar2;
}

Assistant:

bool QParallelAnimationGroupPrivate::shouldAnimationStart(QAbstractAnimation *animation, bool startIfAtEnd) const
{
    const int dura = animation->totalDuration();
    if (dura == -1)
        return !isUncontrolledAnimationFinished(animation);
    if (startIfAtEnd)
        return currentTime <= dura;
    if (direction == QAbstractAnimation::Forward)
        return currentTime < dura;
    else //direction == QAbstractAnimation::Backward
        return currentTime && currentTime <= dura;
}